

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::HttpServer::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int *piVar1;
  int iVar2;
  undefined8 *puVar3;
  StringPtr *pSVar4;
  ArrayPtr<const_char> word3;
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  char *pcVar5;
  size_t sVar6;
  char cVar7;
  long lVar8;
  unsigned_long uVar9;
  _func_int **pp_Var10;
  undefined4 in_register_00000034;
  long lVar11;
  kj *this_00;
  undefined4 in_register_00000084;
  ulong uVar12;
  HttpHeaders *in_R9;
  byte bVar13;
  HttpOutputStream *this_01;
  uint i;
  ArrayPtr<const_char> word1;
  ArrayPtr<const_char> word2;
  char *in_stack_00000008;
  String lengthStr;
  CappedArray<char,_14UL> statusCodeStr;
  _func_int **local_138;
  _func_int **pp_Stack_130;
  ArrayDisposer *local_128;
  undefined1 local_118 [16];
  ArrayDisposer *local_108;
  unsigned_long *local_100;
  size_t *local_f8;
  HttpHeaders *local_f0;
  String local_e8;
  char *local_d0;
  StringPtr *local_c8;
  size_t sStack_c0;
  char *local_b8;
  size_t sStack_b0;
  StringPtr local_a8 [5];
  size_t local_58;
  unsigned_long local_50;
  size_t local_48;
  unsigned_long local_40 [2];
  
  lVar11 = CONCAT44(in_register_00000034,__fd);
  piVar1 = (int *)(lVar11 + 0x150);
  if (*(char *)(lVar11 + 0x148) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1eae,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal((Fault *)local_a8);
  }
  iVar2 = *piVar1;
  uVar12 = CONCAT44(in_register_00000084,__flags);
  if (iVar2 == 1) {
    uVar12 = (ulong)(*(int *)(lVar11 + 0x158) == 1);
  }
  local_100 = &local_50;
  local_f8 = &local_58;
  if (*(char *)(lVar11 + 0x148) != '\0') {
    *(undefined1 *)(lVar11 + 0x148) = 0;
    if (*(int *)(lVar11 + 0x150) == 1) {
      *piVar1 = 0;
    }
    if (*piVar1 == 2) {
      *piVar1 = 0;
    }
  }
  lVar8 = 8;
  do {
    *(char **)((long)local_a8 + lVar8 + -8) = "";
    *(undefined8 *)((long)&local_a8[0].content.ptr + lVar8) = 1;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x78);
  local_138 = (_func_int **)0x0;
  pp_Stack_130 = (_func_int **)0x0;
  local_128 = (ArrayDisposer *)0x0;
  local_f0 = in_R9;
  local_d0 = (char *)__n;
  if ((*(char *)(lVar11 + 0x164) == '\0') &&
     (((*(char *)(*(long *)(lVar11 + 0x18) + 0x70) == '\x01' &&
       (*(char *)(lVar11 + 0x165) != '\x01')) ||
      ((puVar3 = *(undefined8 **)(*(long *)(lVar11 + 0x18) + 0x58), puVar3 != (undefined8 *)0x0 &&
       (cVar7 = (**(code **)*puVar3)(), cVar7 != '\0')))))) {
    *(undefined1 *)(lVar11 + 0x164) = 1;
  }
  if (*(char *)(lVar11 + 0x164) == '\x01') {
    local_a8[0].content.ptr = "close";
    local_a8[0].content.size_ = 6;
  }
  bVar13 = iVar2 == 1 & (byte)uVar12;
  i = (uint)__buf;
  if (i != 0xcc) {
    if (i == 0xcd) {
      uVar9 = 2;
      pp_Var10 = (_func_int **)0x5194bf;
    }
    else {
      if (i == 0x130) goto LAB_003ec802;
      this_00 = (kj *)0x0;
      if (*in_stack_00000008 != '\0') {
        this_00 = (kj *)(in_stack_00000008 + 8);
      }
      if (*in_stack_00000008 == '\x01') {
        if ((bVar13 != 0) && (*(long *)this_00 == 0)) goto LAB_003ec802;
        str<unsigned_long&>((String *)local_118,this_00,local_40);
        local_138 = (_func_int **)local_118._0_8_;
        pp_Stack_130 = (_func_int **)local_118._8_8_;
        pp_Var10 = (_func_int **)0x4d2b65;
        if ((_func_int **)local_118._8_8_ != (_func_int **)0x0) {
          pp_Var10 = (_func_int **)local_118._0_8_;
        }
        local_128 = local_108;
        uVar9 = local_118._8_8_ + (ulong)((_func_int **)local_118._8_8_ == (_func_int **)0x0);
      }
      else {
        uVar9 = 8;
        pp_Var10 = (_func_int **)0x510a7f;
        local_100 = local_40;
        local_f8 = &local_48;
      }
    }
    *local_f8 = (size_t)pp_Var10;
    *local_100 = uVar9;
  }
LAB_003ec802:
  sStack_c0 = 7;
  if (bVar13 != 0) {
    pSVar4 = (local_f0->indexedHeaders).ptr;
    sStack_c0 = 5;
    if (pSVar4[5].content.size_ < 2) {
      sStack_c0 = (ulong)(pSVar4[6].content.size_ < 2) * 2 + 5;
    }
  }
  local_c8 = local_a8;
  kj::_::Stringifier::operator*((CappedArray<char,_14UL> *)local_118,(Stringifier *)&kj::_::STR,i);
  sStack_b0 = CONCAT44(in_register_00000084,__flags) - 1;
  local_b8 = local_d0;
  word3.size_ = sStack_b0;
  word3.ptr = local_d0;
  connectionHeaders.size_ = sStack_c0;
  connectionHeaders.ptr = local_c8;
  word1.size_ = 8;
  word1.ptr = "HTTP/1.1";
  word2.size_ = local_118._0_8_;
  word2.ptr = local_118 + 8;
  HttpHeaders::serialize(&local_e8,local_f0,word1,word2,word3,connectionHeaders);
  this_01 = (HttpOutputStream *)(lVar11 + 0x128);
  anon_unknown_36::HttpOutputStream::writeHeaders(this_01,&local_e8);
  sVar6 = local_e8.content.size_;
  pcVar5 = local_e8.content.ptr;
  if (local_e8.content.ptr != (char *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
              (local_e8.content.disposer,pcVar5,1,sVar6,sVar6,0);
  }
  if (bVar13 == 0) {
    if ((1 < i - 0xcc) && (i != 0x130)) {
      if (*in_stack_00000008 == '\x01') {
        heap<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&,unsigned_long&>
                  ((kj *)local_118,this_01,(unsigned_long *)(in_stack_00000008 + 8));
      }
      else {
        heap<kj::(anonymous_namespace)::HttpChunkedEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&>
                  ((kj *)local_118,this_01);
      }
      (this->super_Response)._vptr_Response = (_func_int **)local_118._0_8_;
      goto LAB_003ec96e;
    }
    anon_unknown_36::HttpOutputStream::finishBody(this_01);
    local_118._8_8_ = operator_new(8);
    *(undefined ***)local_118._8_8_ = &PTR_write_0063ea20;
    pp_Var10 = (_func_int **)
               &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpNullEntityWriter>::instance;
  }
  else {
    anon_unknown_36::HttpOutputStream::finishBody(this_01);
    local_118._8_8_ = operator_new(8);
    *(undefined ***)local_118._8_8_ = &PTR_write_0063e9a0;
    pp_Var10 = (_func_int **)
               &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpDiscardingEntityWriter>::instance
    ;
  }
  (this->super_Response)._vptr_Response = pp_Var10;
LAB_003ec96e:
  (this->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)local_118._8_8_;
  if (local_138 != (_func_int **)0x0) {
    (**local_128->_vptr_ArrayDisposer)(local_128,local_138,1,pp_Stack_130,pp_Stack_130,0);
  }
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
      uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
      kj::Maybe<uint64_t> expectedBodySize) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    currentMethod = kj::none;

    kj::StringPtr connectionHeaders[HttpHeaders::CONNECTION_HEADERS_COUNT];
    kj::String lengthStr;

    if (!closeAfterSend) {
      // Check if application wants us to close connections.
      //
      // If the application used listenHttpCleanDrain() to listen, then it expects that after a
      // clean drain, the connection is still open and can receive more requests. Otherwise, after
      // receiving drain(), we will close the connection, so we should send a `Connection: close`
      // header.
      if (server.draining && !wantCleanDrain) {
        closeAfterSend = true;
      } else KJ_IF_SOME(c, server.settings.callbacks) {
        // The application has registered its own callback to decide whether to send
        // `Connection: close`.
        if (c.shouldClose()) {
          closeAfterSend = true;
        }
      }
    }

    if (closeAfterSend) {
      connectionHeaders[HttpHeaders::BuiltinIndices::CONNECTION] = "close";
    }

    bool isHeadRequest = method.tryGet<HttpMethod>().map([](auto& m) {
        return m == HttpMethod::HEAD;
      }).orDefault(false);

    if (statusCode == 204 || statusCode == 304) {
      // No entity-body.
    } else if (statusCode == 205) {
      // Status code 205 also has no body, but unlike 204 and 304, it must explicitly encode an
      // empty body, e.g. using content-length: 0. I'm guessing this is one of those things,
      // where some early clients expected an explicit body while others assumed an empty body,
      // and so the standard had to choose the common denominator.
      //
      // Spec: https://tools.ietf.org/html/rfc7231#section-6.3.6
      connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = "0";
    } else KJ_IF_SOME(s, expectedBodySize) {
      // HACK: We interpret a zero-length expected body length on responses to HEAD requests to
      //   mean "don't set a Content-Length header at all." This provides a way to omit a body
      //   header on HEAD responses with non-null-body status codes. This is a hack that *only*
      //   makes sense for HEAD responses.
      if (!isHeadRequest || s > 0) {
        lengthStr = kj::str(s);
        connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = lengthStr;
      }
    } else {
      connectionHeaders[HttpHeaders::BuiltinIndices::TRANSFER_ENCODING] = "chunked";
    }